

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int new_node(huffman_code *code)

{
  void *pvVar1;
  long *in_RDI;
  void *new_tree;
  int local_4;
  
  pvVar1 = realloc((void *)*in_RDI,(long)((int)in_RDI[1] + 1) << 3);
  if (pvVar1 == (void *)0x0) {
    local_4 = -1;
  }
  else {
    *in_RDI = (long)pvVar1;
    *(undefined4 *)(*in_RDI + (long)(int)in_RDI[1] * 8) = 0xffffffff;
    *(undefined4 *)(*in_RDI + 4 + (long)(int)in_RDI[1] * 8) = 0xfffffffe;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
new_node(struct huffman_code *code)
{
  void *new_tree;

  new_tree = realloc(code->tree, (code->numentries + 1) * sizeof(*code->tree));
  if (new_tree == NULL)
    return (-1);
  code->tree = (struct huffman_tree_node *)new_tree;
  code->tree[code->numentries].branches[0] = -1;
  code->tree[code->numentries].branches[1] = -2;
  return 1;
}